

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall ncnn::Net::load_model(Net *this,char *modelpath)

{
  FILE *__stream;
  char *in_RSI;
  int ret;
  FILE *fp;
  FILE *in_stack_00000030;
  Net *in_stack_00000038;
  int local_4;
  
  __stream = fopen(in_RSI,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"fopen %s failed\n",in_RSI);
    local_4 = -1;
  }
  else {
    local_4 = load_model(in_stack_00000038,in_stack_00000030);
    fclose(__stream);
  }
  return local_4;
}

Assistant:

int Net::load_model(const char* modelpath)
{
    FILE* fp = fopen(modelpath, "rb");
    if (!fp)
    {
        fprintf(stderr, "fopen %s failed\n", modelpath);
        return -1;
    }

    int ret = load_model(fp);

    fclose(fp);

    return ret;
}